

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_cluster(FMapInfoParser *parse,level_info_t *info)

{
  cluster_info_t *this;
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  FScanner::MustGetNumber(&parse->sc);
  iVar1 = (parse->sc).Number;
  info->cluster = iVar1;
  if ((ulong)wadclusterinfos.Count != 0) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&(wadclusterinfos.Array)->cluster + lVar3) == iVar1) {
        if (lVar3 != 0x47ffffffb8) {
          return;
        }
        break;
      }
      lVar3 = lVar3 + 0x48;
    } while ((ulong)wadclusterinfos.Count * 0x48 != lVar3);
  }
  uVar2 = TArray<cluster_info_t,_cluster_info_t>::Reserve(&wadclusterinfos,1);
  this = wadclusterinfos.Array + uVar2;
  cluster_info_t::Reset(this);
  this->cluster = (parse->sc).Number;
  if (parse->HexenHack == true) {
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(cluster, true)
{
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	info->cluster = parse.sc.Number;

	// If this cluster hasn't been defined yet, add it. This is especially needed
	// for Hexen, because it doesn't have clusterdefs. If we don't do this, every
	// level on Hexen will sometimes be considered as being on the same hub,
	// depending on the check done.
	if (FindWadClusterInfo (parse.sc.Number) == -1)
	{
		unsigned int clusterindex = wadclusterinfos.Reserve(1);
		cluster_info_t *clusterinfo = &wadclusterinfos[clusterindex];
		clusterinfo->Reset();
		clusterinfo->cluster = parse.sc.Number;
		if (parse.HexenHack)
		{
			clusterinfo->flags |= CLUSTER_HUB;
		}
	}
}